

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var Js::TypedArrayBase::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  undefined8 uVar9;
  JavascriptMethod p_Var10;
  uint64 uVar11;
  uint64 uVar12;
  ulong uVar13;
  ulong uVar14;
  double value;
  int in_stack_00000010;
  undefined1 local_b0 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  RecyclableObject *local_78;
  undefined1 local_68 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x743,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d5c231;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,(CallInfo *)&__tag.entry.next);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_b0,function,(CallInfo)__tag.entry.next,
             L"[TypedArray].prototype.forEach",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x747,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d5c231:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Values =
       (Type)ValidateTypedArray((Arguments *)local_68,pSVar1,L"[TypedArray].prototype.forEach");
  if (((ulong)local_68 & 0xfffffe) != 0) {
    uVar6 = (ulong)(((TypedArrayBase *)args.super_Arguments.Values)->super_ArrayBufferParent).
                   super_ArrayObject.length;
    pvVar7 = Arguments::operator[]((Arguments *)local_68,1);
    bVar3 = JavascriptConversion::IsCallable(pvVar7);
    if (bVar3) {
      pvVar7 = Arguments::operator[]((Arguments *)local_68,1);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
      if ((local_68._0_4_ & 0xffffff) < 3) {
        local_78 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        local_78 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_68,2);
      }
      if (uVar6 != 0) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        uVar13 = 0;
        do {
          uVar9 = (**(code **)((long)*args.super_Arguments.Values + 0x390))
                            (args.super_Arguments.Values,uVar13 & 0xffffffff);
          this = pSVar1->threadContext;
          bVar3 = this->reentrancySafeOrHandled;
          this->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
          if (pSVar1->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var10 = RecyclableObject::GetEntryPoint(pRVar8);
          CheckIsExecutable(pRVar8,p_Var10);
          p_Var10 = RecyclableObject::GetEntryPoint(pRVar8);
          if ((int)uVar13 < 0) {
            value = (double)(uVar13 & 0xffffffff);
            uVar11 = NumberUtilities::ToSpecial(value);
            bVar4 = NumberUtilities::IsNan(value);
            if (bVar4) {
              uVar12 = NumberUtilities::ToSpecial(value);
              if (uVar12 != 0xfff8000000000000) {
                uVar12 = NumberUtilities::ToSpecial(value);
                if (uVar12 != 0x7ff8000000000000) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar5 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                              ,0xa2,
                                              "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                              ,"We should only produce a NaN with this value");
                  if (!bVar4) goto LAB_00d5c231;
                  *puVar5 = 0;
                }
              }
            }
            uVar14 = uVar11 ^ 0xfffc000000000000;
          }
          else {
            uVar14 = uVar13 + 0x1000000000000;
          }
          (*p_Var10)(pRVar8,(CallInfo)pRVar8,0x2000004,0,0,0,0,0x2000004,local_78,uVar9,uVar14,
                     args.super_Arguments.Values);
          this->reentrancySafeOrHandled = bVar3;
          uVar13 = uVar13 + 1;
        } while (uVar6 != uVar13);
      }
      pRVar8 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_b0);
      return pRVar8;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"[TypedArray].prototype.forEach");
}

Assistant:

Var TypedArrayBase::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.forEach"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_forEach);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.forEach"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.forEach"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        for (uint32 k = 0; k < length; k++)
        {
            // No need for HasItem, as we have already established that this API can be called only on the TypedArray object. So Proxy scenario cannot happen.

            Var element = typedArrayBase->DirectGetItem(k);

            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(),
                    callBackFn, CallInfo(CallFlags_Value, 4),
                    thisArg,
                    element,
                    JavascriptNumber::ToVar(k, scriptContext),
                    typedArrayBase);
            }
            END_SAFE_REENTRANT_CALL
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }